

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::SocketStream::read(SocketStream *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  read((SocketStream *)
       ((long)&(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream +
       (long)(this->super_DisconnectableStream).super_SelectableStream._vptr_SelectableStream[-6]),
       in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

virtual void read(void* data, size_t size)
		{
			assert(fd >= 0);

			if (size == 0)
				return;

			unsigned char* ptr = (unsigned char*)data;
			size_t left = size;

			if (isDataInRecvBuffer())
			{
				size_t toCopy = std::min(recvBufferSize - recvBufferPos, size);
				memcpy(ptr, recvBuffer + recvBufferPos, toCopy);
				recvBufferPos += toCopy;
				ptr += toCopy;
				left -= toCopy;
			}

			while (left)
			{
				ssize_t len = recv(fd, ptr, left, 0);

				if (len < 0)
				{
					fail(DashelException::IOError, errno, "Socket read I/O error.");
				}
				else if (len == 0)
				{
					fail(DashelException::ConnectionLost, 0, "Connection lost.");
				}
				else
				{
					ptr += len;
					left -= len;
				}
			}
		}